

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

bool __thiscall Json::Reader::match(Reader *this,Location pattern,int patternLength)

{
  int iVar1;
  int local_28;
  int index;
  int patternLength_local;
  Location pattern_local;
  Reader *this_local;
  
  local_28 = patternLength;
  if ((long)patternLength <= (long)this->end_ - (long)this->current_) {
    do {
      iVar1 = local_28 + -1;
      if (local_28 == 0) {
        this->current_ = this->current_ + patternLength;
        return true;
      }
      local_28 = iVar1;
    } while (this->current_[iVar1] == pattern[iVar1]);
  }
  return false;
}

Assistant:

bool Reader::match(Location pattern, int patternLength) {
  if (end_ - current_ < patternLength)
    return false;
  int index = patternLength;
  while (index--)
    if (current_[index] != pattern[index])
      return false;
  current_ += patternLength;
  return true;
}